

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::FileDescriptorProto::FileDescriptorProto
          (FileDescriptorProto *this,FileDescriptorProto *from)

{
  InternalMetadata *this_00;
  ulong uVar1;
  uint uVar2;
  LogMessage *pLVar3;
  FileOptions *this_01;
  SourceCodeInfo *this_02;
  undefined8 *puVar4;
  FileOptions *from_00;
  SourceCodeInfo *from_01;
  LogFinisher local_99;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *local_98;
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *local_90;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *local_88;
  RepeatedField<int> *local_80;
  RepeatedPtrField<google::protobuf::DescriptorProto> *local_78;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_70;
  LogMessage local_68;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  (this->super_Message).super_MessageLite._internal_metadata_.ptr_ = 0;
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__FileDescriptorProto_004d4e68;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  *(undefined8 *)&this->_cached_size_ = 0;
  *(undefined8 *)((long)&(this->dependency_).super_RepeatedPtrFieldBase.arena_ + 4) = 0;
  (this->dependency_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->dependency_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->dependency_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->dependency_).super_RepeatedPtrFieldBase,
             &(from->dependency_).super_RepeatedPtrFieldBase);
  (this->message_type_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->message_type_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->message_type_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->message_type_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  local_70 = &this->dependency_;
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
            (&(this->message_type_).super_RepeatedPtrFieldBase,
             &(from->message_type_).super_RepeatedPtrFieldBase);
  local_88 = &this->enum_type_;
  (this->enum_type_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->enum_type_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->enum_type_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  local_78 = &this->message_type_;
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
            (&local_88->super_RepeatedPtrFieldBase,&(from->enum_type_).super_RepeatedPtrFieldBase);
  local_90 = &this->service_;
  (this->service_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->service_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->service_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->service_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
            (&local_90->super_RepeatedPtrFieldBase,&(from->service_).super_RepeatedPtrFieldBase);
  local_98 = &this->extension_;
  (this->extension_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->extension_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->extension_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->extension_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
            (&local_98->super_RepeatedPtrFieldBase,&(from->extension_).super_RepeatedPtrFieldBase);
  local_80 = &this->public_dependency_;
  RepeatedField<int>::RepeatedField(local_80,&from->public_dependency_);
  RepeatedField<int>::RepeatedField(&this->weak_dependency_,&from->weak_dependency_);
  uVar1 = (from->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (this_00,(UnknownFieldSet *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  (this->name_).tagged_ptr_.ptr_ = &internal::fixed_address_empty_string_abi_cxx11_;
  uVar2 = (from->_has_bits_).has_bits_[0];
  if ((uVar2 & 1) != 0) {
    puVar4 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
    if ((this_00->ptr_ & 1U) != 0) {
      puVar4 = (undefined8 *)*puVar4;
    }
    internal::ArenaStringPtr::Set
              (&this->name_,(ulong)(from->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe,puVar4);
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  (this->package_).tagged_ptr_.ptr_ = &internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar2 & 2) != 0) {
    puVar4 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
    if ((this_00->ptr_ & 1U) != 0) {
      puVar4 = (undefined8 *)*puVar4;
    }
    internal::ArenaStringPtr::Set
              (&this->package_,(ulong)(from->package_).tagged_ptr_.ptr_ & 0xfffffffffffffffe,puVar4)
    ;
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  (this->syntax_).tagged_ptr_.ptr_ = &internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar2 & 4) != 0) {
    puVar4 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
    if ((this_00->ptr_ & 1U) != 0) {
      puVar4 = (undefined8 *)*puVar4;
    }
    internal::ArenaStringPtr::Set
              (&this->syntax_,(ulong)(from->syntax_).tagged_ptr_.ptr_ & 0xfffffffffffffffe,puVar4);
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  from_00 = from->options_;
  if ((from_00 == (FileOptions *)0x0 & (byte)uVar2 >> 3) == 1) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.h"
               ,0x2320);
    pLVar3 = internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: !value || options_ != nullptr: ");
    internal::LogFinisher::operator=(&local_99,pLVar3);
    internal::LogMessage::~LogMessage(&local_68);
    from_00 = from->options_;
LAB_0036b9b4:
    this_01 = (FileOptions *)operator_new(0xa8);
    FileOptions::FileOptions(this_01,from_00);
    this->options_ = this_01;
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  else {
    if ((uVar2 & 8) != 0) goto LAB_0036b9b4;
    this->options_ = (FileOptions *)0x0;
  }
  from_01 = from->source_code_info_;
  if ((from_01 == (SourceCodeInfo *)0x0 & (byte)uVar2 >> 4) == 1) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.h"
               ,0x237a);
    pLVar3 = internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: !value || source_code_info_ != nullptr: ");
    internal::LogFinisher::operator=(&local_99,pLVar3);
    internal::LogMessage::~LogMessage(&local_68);
    from_01 = from->source_code_info_;
  }
  else if ((uVar2 & 0x10) == 0) {
    this_02 = (SourceCodeInfo *)0x0;
    goto LAB_0036ba68;
  }
  this_02 = (SourceCodeInfo *)operator_new(0x30);
  SourceCodeInfo::SourceCodeInfo(this_02,from_01);
LAB_0036ba68:
  this->source_code_info_ = this_02;
  return;
}

Assistant:

FileDescriptorProto::FileDescriptorProto(const FileDescriptorProto& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _has_bits_(from._has_bits_),
      dependency_(from.dependency_),
      message_type_(from.message_type_),
      enum_type_(from.enum_type_),
      service_(from.service_),
      extension_(from.extension_),
      public_dependency_(from.public_dependency_),
      weak_dependency_(from.weak_dependency_) {
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
  name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    name_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (from._internal_has_name()) {
    name_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_name(), 
      GetArenaForAllocation());
  }
  package_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    package_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (from._internal_has_package()) {
    package_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_package(), 
      GetArenaForAllocation());
  }
  syntax_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    syntax_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (from._internal_has_syntax()) {
    syntax_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_syntax(), 
      GetArenaForAllocation());
  }
  if (from._internal_has_options()) {
    options_ = new ::PROTOBUF_NAMESPACE_ID::FileOptions(*from.options_);
  } else {
    options_ = nullptr;
  }
  if (from._internal_has_source_code_info()) {
    source_code_info_ = new ::PROTOBUF_NAMESPACE_ID::SourceCodeInfo(*from.source_code_info_);
  } else {
    source_code_info_ = nullptr;
  }
  // @@protoc_insertion_point(copy_constructor:google.protobuf.FileDescriptorProto)
}